

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

void google::glog_internal_namespace_::MyUserNameInitializer(void)

{
  __uid_t __uid;
  int iVar1;
  ulong uVar2;
  int pwuid_res;
  uid_t uid;
  char buffer [1024];
  passwd *result;
  passwd pwd;
  char *user;
  
  pwd.pw_shell = getenv("USER");
  if (pwd.pw_shell == (char *)0x0) {
    buffer[0x3f8] = '\0';
    buffer[0x3f9] = '\0';
    buffer[0x3fa] = '\0';
    buffer[0x3fb] = '\0';
    buffer[0x3fc] = '\0';
    buffer[0x3fd] = '\0';
    buffer[0x3fe] = '\0';
    buffer[0x3ff] = '\0';
    memset(&pwuid_res,0,0x400);
    __uid = geteuid();
    iVar1 = getpwuid_r(__uid,(passwd *)&result,(char *)&pwuid_res,0x400,(passwd **)(buffer + 0x3f8))
    ;
    if ((iVar1 == 0) && (buffer._1016_8_ != 0)) {
      std::__cxx11::string::operator=((string *)g_my_user_name_abi_cxx11_,(char *)result);
    }
    else {
      snprintf((char *)&pwuid_res,0x400,"uid%d",(ulong)__uid);
      std::__cxx11::string::operator=((string *)g_my_user_name_abi_cxx11_,(char *)&pwuid_res);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::string::operator=((string *)g_my_user_name_abi_cxx11_,"invalid-user");
    }
  }
  else {
    std::__cxx11::string::operator=((string *)g_my_user_name_abi_cxx11_,pwd.pw_shell);
  }
  return;
}

Assistant:

static void MyUserNameInitializer() {
  // TODO(hamaji): Probably this is not portable.
#if defined(GLOG_OS_WINDOWS)
  const char* user = getenv("USERNAME");
#else
  const char* user = getenv("USER");
#endif
  if (user != nullptr) {
    g_my_user_name = user;
  } else {
#if defined(HAVE_PWD_H) && defined(HAVE_UNISTD_H)
    struct passwd pwd;
    struct passwd* result = nullptr;
    char buffer[1024] = {'\0'};
    uid_t uid = geteuid();
    int pwuid_res = getpwuid_r(uid, &pwd, buffer, sizeof(buffer), &result);
    if (pwuid_res == 0 && result) {
      g_my_user_name = pwd.pw_name;
    } else {
      std::snprintf(buffer, sizeof(buffer), "uid%d", uid);
      g_my_user_name = buffer;
    }
#endif
    if (g_my_user_name.empty()) {
      g_my_user_name = "invalid-user";
    }
  }
}